

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void triangle_textured(array<vec<3UL,_int>,_3UL> pts,array<vec<2UL,_double>,_3UL> uvs,
                      vector<double,_std::allocator<double>_> *zbuffer,TGAImage *image,Model *model)

{
  int iVar1;
  pointer pdVar2;
  vec3i P;
  TGAColor TVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  double *pdVar10;
  double *pdVar11;
  int i;
  size_t sVar12;
  vec3i *pvVar13;
  int j;
  int iVar14;
  double dVar15;
  TGAColor color;
  vec2f local_b8;
  double *local_a0;
  vec3i *local_98;
  vec2i bboxmax;
  vec2i bboxmin;
  vec2i clamp;
  vec3f bc_screen;
  
  local_a0 = (double *)&uvs;
  bboxmin.x = 0x7fffffff;
  bboxmin.y = 0x7fffffff;
  bboxmax.x = -0x80000000;
  bboxmax.y = -0x80000000;
  sVar4 = TGAImage::get_width(image);
  sVar5 = TGAImage::get_height(image);
  clamp.y = (int)sVar5 + -1;
  clamp.x = (int)sVar4 + -1;
  for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
    for (sVar4 = 0; sVar4 != 2; sVar4 = sVar4 + 1) {
      piVar6 = vec<2UL,_int>::operator[](&bboxmin,sVar4);
      piVar7 = vec<3UL,_int>::operator[](pts._M_elems + lVar9,sVar4);
      iVar14 = *piVar6;
      if (*piVar7 < *piVar6) {
        iVar14 = *piVar7;
      }
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      piVar6 = vec<2UL,_int>::operator[](&bboxmin,sVar4);
      *piVar6 = iVar14;
      piVar6 = vec<2UL,_int>::operator[](&clamp,sVar4);
      piVar7 = vec<2UL,_int>::operator[](&bboxmax,sVar4);
      piVar8 = vec<3UL,_int>::operator[](pts._M_elems + lVar9,sVar4);
      iVar14 = *piVar8;
      if (*piVar8 < *piVar7) {
        iVar14 = *piVar7;
      }
      if (*piVar6 <= iVar14) {
        iVar14 = *piVar6;
      }
      piVar6 = vec<2UL,_int>::operator[](&bboxmax,sVar4);
      *piVar6 = iVar14;
    }
  }
  pvVar13 = pts._M_elems + 2;
  local_a0 = &((vec<2UL,_double> *)local_a0)->y;
  iVar14 = 0;
  local_98 = pvVar13;
  for (sVar4 = (size_t)bboxmin.x; (long)sVar4 <= (long)bboxmax.x; sVar4 = sVar4 + 1) {
    for (sVar5 = (size_t)bboxmin.y; (long)sVar5 <= (long)bboxmax.y; sVar5 = sVar5 + 1) {
      P.y = (int)sVar5;
      P.x = (int)sVar4;
      P.z = iVar14;
      barycentric(&bc_screen,pts._M_elems[0],pts._M_elems[1],*pvVar13,P);
      if (((0.0 <= bc_screen.x) && (0.0 <= bc_screen.y)) && (0.0 <= bc_screen.z)) {
        iVar14 = 0;
        piVar6 = &pts._M_elems[0].z;
        for (sVar12 = 0; sVar12 != 3; sVar12 = sVar12 + 1) {
          iVar1 = *piVar6;
          pdVar10 = vec<3UL,_double>::operator[](&bc_screen,sVar12);
          iVar14 = iVar14 + (int)((double)iVar1 * *pdVar10);
          piVar6 = piVar6 + 3;
        }
        pdVar2 = (zbuffer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar15 = (double)iVar14;
        pdVar10 = pdVar2 + sVar5 * 600 + sVar4;
        pvVar13 = local_98;
        if (*pdVar10 <= dVar15 && dVar15 != *pdVar10) {
          pdVar2[sVar5 * 600 + sVar4] = dVar15;
          local_b8.x = 0.0;
          local_b8.y = 0.0;
          pdVar10 = local_a0;
          for (sVar12 = 0; sVar12 != 3; sVar12 = sVar12 + 1) {
            dVar15 = ((vec<2UL,_double> *)(pdVar10 + -1))->x;
            pdVar11 = vec<3UL,_double>::operator[](&bc_screen,sVar12);
            local_b8.x = dVar15 * *pdVar11 + local_b8.x;
            dVar15 = *pdVar10;
            pdVar11 = vec<3UL,_double>::operator[](&bc_screen,sVar12);
            local_b8.y = dVar15 * *pdVar11 + local_b8.y;
            pdVar10 = pdVar10 + 2;
          }
          TVar3 = Model::diffuse(model,&local_b8);
          color.bgra = TVar3.bgra;
          color.bytespp = TVar3.bytespp;
          TGAImage::set(image,sVar4,sVar5,&color);
          pvVar13 = local_98;
        }
      }
    }
  }
  return;
}

Assistant:

void triangle_textured(std::array<vec3i, 3> pts, std::array<vec2f, 3> uvs,
                       std::vector<double> &zbuffer, TGAImage &image, Model &model)
{
    vec2i bboxmin(std::numeric_limits<int>::max(), std::numeric_limits<int>::max());
    vec2i bboxmax(std::numeric_limits<int>::min(), std::numeric_limits<int>::min());
    vec2i clamp(image.get_width() - 1, image.get_height() - 1);
    for (int i = 0; i < 3; i++) {
        for (int j = 0; j < 2; j++) {
            bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
            bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
        }
    }
    vec3i P;
    for (P.x = bboxmin.x; P.x <= bboxmax.x; P.x++) {
        for (P.y = bboxmin.y; P.y <= bboxmax.y; P.y++) {
            vec3f bc_screen = barycentric(pts[0], pts[1], pts[2], P);
            if (bc_screen.x < 0 || bc_screen.y < 0 || bc_screen.z < 0) continue;
            P.z = 0;
            for (int i = 0; i < 3; i++) P.z += static_cast<int>(pts[i][2] * bc_screen[i]);
            if (zbuffer[P.x + P.y * width] < P.z) {
                zbuffer[P.x + P.y * width] = P.z;
                vec2f uv{0, 0};
                for (int i = 0; i < 3; i++) {
                    uv.x += uvs[i].x * bc_screen[i];
                    uv.y += uvs[i].y * bc_screen[i];
                }
                TGAColor color = model.diffuse(uv);

                image.set(P.x, P.y, color);
            }
        }
    }
}